

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O3

double * numerary::Numerary::integrate_simpson
                   (_func_double_double *f,double *a,double *b,double *eps)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double local_58;
  double dStack_50;
  
  pdVar2 = (double *)operator_new__(0x10);
  dVar12 = *a;
  dVar10 = 0.0;
  dVar11 = 0.0;
  if (dVar12 < *b - *eps) {
    dVar13 = *b - dVar12;
    dVar10 = 0.0;
    dVar11 = 0.0;
    do {
      dVar4 = (*f)(dVar12);
      dVar5 = (*f)(dVar13 * 0.5 + dVar12);
      dVar6 = (*f)(dVar13 + dVar12);
      auVar9._8_8_ = dVar13;
      auVar9._0_8_ = dVar13;
      auVar9 = divpd(auVar9,_DAT_001a2450);
      dVar7 = (*f)(dVar13 * 0.25 + dVar12);
      dVar8 = (*f)(dVar13 * 3.0 * 0.25 + dVar12);
      local_58 = auVar9._0_8_;
      dStack_50 = auVar9._8_8_;
      local_58 = (dVar6 + dVar8 * 4.0 + dVar5 + dVar5 + dVar7 * 4.0 + dVar4) * local_58;
      dVar7 = ABS((local_58 - (dVar6 + dVar5 * 4.0 + dVar4) * dStack_50) / 15.0);
      dVar6 = pow(dVar7 / *eps,0.2);
      dVar4 = *eps;
      dVar5 = dVar13 + dVar12;
      if (dVar4 <= dVar7) {
        dVar5 = dVar12;
      }
      dVar12 = 10000.0;
      if (dVar6 <= 10000.0) {
        dVar12 = dVar6;
      }
      dVar6 = 0.0001;
      if (0.0001 <= dVar12) {
        dVar6 = dVar12;
      }
      dVar6 = (dVar13 * 0.95) / dVar6;
      uVar1 = (uint)(dVar7 < dVar4);
      auVar14._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
      auVar14._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
      auVar14._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
      dVar10 = (double)(~auVar14._0_8_ & (ulong)dVar10 | (ulong)(local_58 + dVar10) & auVar14._0_8_)
      ;
      dVar11 = (double)(~auVar14._8_8_ & (ulong)dVar11 | (ulong)(dVar7 + dVar11) & auVar14._8_8_);
      dVar7 = *b;
      uVar3 = -(ulong)(dVar7 < dVar6 + dVar5);
      dVar13 = (double)(~uVar3 & (ulong)dVar6 | (ulong)(dVar7 - dVar5) & uVar3);
      dVar12 = dVar5;
    } while (dVar5 < dVar7 - dVar4);
  }
  *pdVar2 = dVar10;
  pdVar2[1] = dVar11;
  return pdVar2;
}

Assistant:

double* Numerary::integrate_simpson(double (*f)(double), const double& a, const double& b, const double& eps)
    {
        double *return_value = new double[2], x = a, I_1, I_2, dt, chi, h = b - a, h_new, error = 0, ans = 0, fx_1, fx_2, fx_3;
        
        while (x < b - eps) {
            // Simpson's rule formulas
            fx_1 = f(x), fx_2 = f(x + h/2), fx_3 = f(x + h);
            I_1 = (h/6) * (fx_1 + 4*fx_2 + fx_3);
            I_2 = (h/12) * (fx_1 + 4*f(x + h/4) + 2*fx_2 + 4*f(x + (3*h)/4) + fx_3);

            dt = (I_2 - I_1) / 15;
            chi = pow(fabs(dt)/eps, 0.2);

            if(chi > 1e4) chi = 1e4;
            if(chi < 1e-4) chi = 1e-4;

            h_new = 0.95 * h / chi;

            if(fabs(dt) < eps) {
                x += h;
                ans += I_2;
                error += fabs(dt);
            }

            h = h_new;
            if(x + h > b) h = b - x;
        }

        return_value[0] = ans;
        return_value[1] = error;

        return return_value;
    }